

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O2

uint8_t gb_common_reads(MemoryBankController *mc,uint16_t address)

{
  uint8_t uVar1;
  uint uVar2;
  undefined6 in_register_00000032;
  ulong uVar3;
  
  uVar2 = (int)CONCAT62(in_register_00000032,address) - 0xff00;
  uVar3 = (ulong)uVar2;
  if (uVar2 < 0x21) {
    if ((0x129000002U >> (uVar3 & 0x3f) & 1) != 0) {
      return 0xff;
    }
    if (uVar3 == 0) {
      if ((mc->memory[0xff00] & 0x20) == 0) {
        return mc->buttons >> 4;
      }
      uVar1 = 0xff;
      if ((mc->memory[0xff00] & 0x10) == 0) {
        uVar1 = mc->buttons;
      }
      return uVar1;
    }
    if (uVar3 == 0xf) {
      return mc->memory[0xff0f] | 0xe0;
    }
  }
  return mc->memory[address];
}

Assistant:

uint8_t gb_common_reads(MemoryBankController* mc, uint16_t address) {

    switch (address) {
    case JOYP:
        return gb_read_joypad_input(mc);
    case IF:
        return mc->memory[address] | 0xE0;
    case 0xFF01: case 0xFF18: case 0xFF1B:
    case 0xFF1D: case 0xFF20:
        return 0xFF;
    default:
        return mc->memory[address];
    }
}